

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_CreateWindow(ImGuiViewport *viewport)

{
  ImGuiViewportDataGlfw *this;
  GLFWwindow *pGVar1;
  long in_RDI;
  GLFWwindow *share_window;
  ImGuiViewportDataGlfw *data;
  GLFWwindow *in_stack_00000370;
  GLFWmonitor *in_stack_00000378;
  char *in_stack_00000380;
  int in_stack_00000388;
  int in_stack_0000038c;
  GLFWwindow *pGVar2;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int hint;
  GLFWwindow *handle;
  
  handle = (GLFWwindow *)0x10;
  ImGui::MemAlloc(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  this = (ImGuiViewportDataGlfw *)operator_new(handle);
  ImGuiViewportDataGlfw::ImGuiViewportDataGlfw(this);
  *(ImGuiViewportDataGlfw **)(in_RDI + 0x38) = this;
  hint = 0;
  glfwWindowHint(0,in_stack_ffffffffffffffb0);
  glfwWindowHint(hint,in_stack_ffffffffffffffb0);
  glfwWindowHint(hint,in_stack_ffffffffffffffb0);
  glfwWindowHint(hint,in_stack_ffffffffffffffb0);
  glfwWindowHint(hint,in_stack_ffffffffffffffb0);
  pGVar2 = g_Window;
  if (g_ClientApi != GlfwClientApi_OpenGL) {
    pGVar2 = (GLFWwindow *)0x0;
  }
  pGVar1 = glfwCreateWindow(in_stack_0000038c,in_stack_00000388,in_stack_00000380,in_stack_00000378,
                            in_stack_00000370);
  this->Window = pGVar1;
  this->WindowOwned = true;
  *(GLFWwindow **)(in_RDI + 0x40) = this->Window;
  glfwSetWindowPos((GLFWwindow *)CONCAT44(hint,in_stack_ffffffffffffffb0),
                   (int)((ulong)pGVar2 >> 0x20),(int)pGVar2);
  glfwSetMouseButtonCallback(handle,(GLFWmousebuttonfun)CONCAT44(hint,in_stack_ffffffffffffffb0));
  glfwSetScrollCallback(handle,(GLFWscrollfun)CONCAT44(hint,in_stack_ffffffffffffffb0));
  glfwSetKeyCallback(handle,(GLFWkeyfun)CONCAT44(hint,in_stack_ffffffffffffffb0));
  glfwSetCharCallback(handle,(GLFWcharfun)CONCAT44(hint,in_stack_ffffffffffffffb0));
  glfwSetWindowCloseCallback(handle,(GLFWwindowclosefun)CONCAT44(hint,in_stack_ffffffffffffffb0));
  glfwSetWindowPosCallback(handle,(GLFWwindowposfun)CONCAT44(hint,in_stack_ffffffffffffffb0));
  glfwSetWindowSizeCallback(handle,(GLFWwindowsizefun)CONCAT44(hint,in_stack_ffffffffffffffb0));
  if (g_ClientApi == GlfwClientApi_OpenGL) {
    glfwMakeContextCurrent((GLFWwindow *)CONCAT44(hint,in_stack_ffffffffffffffb0));
    glfwSwapInterval(hint);
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_CreateWindow(ImGuiViewport* viewport)
{
    ImGuiViewportDataGlfw* data = IM_NEW(ImGuiViewportDataGlfw)();
    viewport->PlatformUserData = data;

    // GLFW 3.2 unfortunately always set focus on glfwCreateWindow() if GLFW_VISIBLE is set, regardless of GLFW_FOCUSED
    // With GLFW 3.3, the hint GLFW_FOCUS_ON_SHOW fixes this problem
    glfwWindowHint(GLFW_VISIBLE, false);
    glfwWindowHint(GLFW_FOCUSED, false);
#if GLFW_HAS_FOCUS_ON_SHOW
     glfwWindowHint(GLFW_FOCUS_ON_SHOW, false);
 #endif
    glfwWindowHint(GLFW_DECORATED, (viewport->Flags & ImGuiViewportFlags_NoDecoration) ? false : true);
#if GLFW_HAS_WINDOW_TOPMOST
    glfwWindowHint(GLFW_FLOATING, (viewport->Flags & ImGuiViewportFlags_TopMost) ? true : false);
#endif
    GLFWwindow* share_window = (g_ClientApi == GlfwClientApi_OpenGL) ? g_Window : NULL;
    data->Window = glfwCreateWindow((int)viewport->Size.x, (int)viewport->Size.y, "No Title Yet", NULL, share_window);
    data->WindowOwned = true;
    viewport->PlatformHandle = (void*)data->Window;
#ifdef _WIN32
    viewport->PlatformHandleRaw = glfwGetWin32Window(data->Window);
#endif
    glfwSetWindowPos(data->Window, (int)viewport->Pos.x, (int)viewport->Pos.y);

    // Install callbacks for secondary viewports
    glfwSetMouseButtonCallback(data->Window, ImGui_ImplGlfw_MouseButtonCallback);
    glfwSetScrollCallback(data->Window, ImGui_ImplGlfw_ScrollCallback);
    glfwSetKeyCallback(data->Window, ImGui_ImplGlfw_KeyCallback);
    glfwSetCharCallback(data->Window, ImGui_ImplGlfw_CharCallback);
    glfwSetWindowCloseCallback(data->Window, ImGui_ImplGlfw_WindowCloseCallback);
    glfwSetWindowPosCallback(data->Window, ImGui_ImplGlfw_WindowPosCallback);
    glfwSetWindowSizeCallback(data->Window, ImGui_ImplGlfw_WindowSizeCallback);
    if (g_ClientApi == GlfwClientApi_OpenGL)
    {
        glfwMakeContextCurrent(data->Window);
        glfwSwapInterval(0);
    }
}